

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarks.c
# Opt level: O1

void benchmark(Benchmarks *bench)

{
  ulong uVar1;
  double dVar2;
  timespec ts;
  long local_20;
  long local_18;
  
  timespec_get(&local_20,1);
  dVar2 = (double)local_20 * 1000000000.0 + (double)local_18;
  uVar1 = (ulong)dVar2;
  uVar1 = ((long)(dVar2 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1) -
          bench->single_start;
  if (uVar1 < bench->minimum) {
    bench->minimum = uVar1;
  }
  if (bench->maximum < uVar1) {
    bench->maximum = uVar1;
  }
  bench->sum = bench->sum + uVar1;
  bench->squared_sum = bench->squared_sum + uVar1 * uVar1;
  return;
}

Assistant:

void benchmark(Benchmarks* bench) {
	const bench_t time = now() - bench->single_start;

	if (time < bench->minimum) {
		bench->minimum = time;
	}

	if (time > bench->maximum) {
		bench->maximum = time;
	}

	bench->sum += time;
	bench->squared_sum += (time * time);
}